

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DoWhileStatementSyntax *pDVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_RBX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  Token *in_stack_00000030;
  ExpressionSyntax *in_stack_00000038;
  Token *in_stack_00000040;
  Token *in_stack_00000048;
  BumpAllocator *in_stack_00000098;
  Token *in_stack_000000a0;
  BumpAllocator *in_stack_ffffffffffffff48;
  StatementSyntax *in_stack_ffffffffffffff50;
  NamedLabelSyntax *local_80;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_80 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_80 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(unaff_retaddr,(BumpAllocator *)unaff_RBX);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x772d02);
  deepClone<slang::syntax::StatementSyntax>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x772d77);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000008,(NamedLabelSyntax **)unaff_retaddr,unaff_RBX,(Token *)__fn,
                      (StatementSyntax *)__child_stack,(Token *)local_80,in_stack_00000030,
                      in_stack_00000038,in_stack_00000040,in_stack_00000048);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DoWhileStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DoWhileStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.doKeyword.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc),
        node.whileKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}